

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_std_getset(lua_State *L,ptrdiff_t id,char *mode)

{
  undefined4 *puVar1;
  lua_State *in_RDX;
  long in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  
  if ((*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 4) != -1)) {
    if (*(int *)(*(long *)(in_RDI + 0x10) + 4) == -0xd) {
      io_tofile(in_RDX);
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + 8;
    }
    else {
      io_file_open(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    *(undefined4 *)((ulong)*(uint *)(in_RDI + 8) + 0x198 + in_RSI * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x18) + -8);
  }
  else {
    puVar1 = *(undefined4 **)(in_RDI + 0x18);
    *(undefined4 **)(in_RDI + 0x18) = puVar1 + 2;
    *puVar1 = *(undefined4 *)((ulong)*(uint *)(in_RDI + 8) + 0x198 + in_RSI * 4);
    puVar1[1] = 0xfffffff3;
  }
  return 1;
}

Assistant:

static int io_std_getset(lua_State *L, ptrdiff_t id, const char *mode)
{
  if (L->base < L->top && !tvisnil(L->base)) {
    if (tvisudata(L->base)) {
      io_tofile(L);
      L->top = L->base+1;
    } else {
      io_file_open(L, mode);
    }
    /* NOBARRIER: The standard I/O handles are GC roots. */
    setgcref(G(L)->gcroot[id], gcV(L->top-1));
  } else {
    setudataV(L, L->top++, IOSTDF_UD(L, id));
  }
  return 1;
}